

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<16,_6,_6>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  undefined4 in_register_00000014;
  ShaderEvalContext *extraout_RDX;
  ShaderEvalContext *extraout_RDX_00;
  ShaderEvalContext *evalCtx_00;
  Type in1;
  Type in0;
  Mat2x3 local_8c;
  Mat2x3 local_74;
  MatrixCaseUtils local_5c [12];
  VecAccess<float,_4,_3> local_50;
  Matrix<float,_3,_2> local_38;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,6>
              (&local_74,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
    evalCtx_00 = extraout_RDX;
  }
  else {
    tcu::Matrix<float,_3,_2>::Matrix(&local_74,(float *)sr::(anonymous_namespace)::s_constInMat2x3);
    evalCtx_00 = extraout_RDX_00;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,6>
              (&local_8c,(MatrixCaseUtils *)evalCtx,evalCtx_00,in_ECX);
  }
  else {
    tcu::Matrix<float,_3,_2>::Matrix
              (&local_8c,(float *)(sr::(anonymous_namespace)::s_constInMat2x3 + 0x18));
  }
  tcu::operator-(&local_38,&local_74,&local_8c);
  reduceToVec3(local_5c,&local_38);
  local_50.m_vector = &evalCtx->color;
  local_50.m_index[0] = 0;
  local_50.m_index[1] = 1;
  local_50.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_50,(Vector<float,_3> *)local_5c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 - in1);
	}